

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

void __thiscall
ThreadData::ThreadData
          (ThreadData *this,ThreadFunc *func,string *name,pid_t *tid,CountDownLatch *latch)

{
  pointer pcVar1;
  
  std::function<void_()>::function(&this->func_,func);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  this->tid_ = tid;
  this->latch_ = latch;
  return;
}

Assistant:

ThreadData(const ThreadFunc& func, const string& name, pid_t* tid, CountDownLatch* latch)
            : func_(func), name_(name), tid_(tid), latch_(latch) { }